

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsPacket.h
# Opt level: O0

void __thiscall
ExtDataBlockInfo::ExtDataBlockInfo
          (ExtDataBlockInfo *this,uint8_t *a_data,int a_dataLen,int a_id1,int a_id2)

{
  bool bVar1;
  uchar *__dest;
  size_type __n;
  int a_id2_local;
  int a_id1_local;
  int a_dataLen_local;
  uint8_t *a_data_local;
  ExtDataBlockInfo *this_local;
  
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&this->data);
  this->id1 = a_id1;
  this->id2 = a_id2;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&this->data,(long)a_dataLen);
  bVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::empty(&this->data);
  if (!bVar1) {
    __dest = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(&this->data);
    __n = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->data);
    memcpy(__dest,a_data,__n);
  }
  return;
}

Assistant:

ExtDataBlockInfo(const uint8_t* a_data, const int a_dataLen, const int a_id1, const int a_id2)
        : id1(a_id1), id2(a_id2)
    {
        data.resize(a_dataLen);
        if (!data.empty())
            memcpy(data.data(), a_data, data.size());
    }